

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

ShaderProgram * __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageBindingNegativeCase::generateShaders
          (ImageBindingNegativeCase *this)

{
  string *name;
  uint uVar1;
  ShaderType SVar2;
  DataType DVar3;
  char *pcVar4;
  ulong uVar5;
  ostream *poVar6;
  ProgramSources *pPVar7;
  ShaderProgram *this_00;
  uint uVar8;
  DataType dataType;
  int iVar9;
  ulong uVar10;
  undefined1 local_a80 [40];
  ulong local_a58;
  string local_a50;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string imageType;
  undefined1 local_990 [40];
  string local_968;
  string texCoordType;
  ProgramSources sources;
  undefined1 local_858 [176];
  pointer local_7a8;
  undefined1 uStack_7a0;
  undefined7 uStack_79f;
  undefined1 uStack_798;
  undefined8 uStack_797;
  ostringstream shaderBody;
  ostringstream tessEvalUniformDecl;
  ostringstream tessCtrlUniformDecl;
  ostringstream fragmentUniformDecl;
  ostringstream vertexUniformDecl;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vertexUniformDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fragmentUniformDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessCtrlUniformDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&tessEvalUniformDecl);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&shaderBody);
  iVar9 = *(int *)&(this->super_LayoutBindingNegativeCase).field_0x134;
  DVar3 = TYPE_INT_VEC3;
  if (iVar9 != 0x904e) {
    DVar3 = TYPE_INVALID;
  }
  dataType = TYPE_INT_VEC2;
  if (iVar9 != 0x904d) {
    dataType = DVar3;
  }
  pcVar4 = glu::getDataTypeName(dataType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&texCoordType,pcVar4,(allocator<char> *)&sources);
  DVar3 = glu::getDataTypeFromGLType
                    (*(deUint32 *)&(this->super_LayoutBindingNegativeCase).field_0x134);
  pcVar4 = glu::getDataTypeName(DVar3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&imageType,pcVar4,(allocator<char> *)&sources);
  uVar1 = (this->super_LayoutBindingNegativeCase).m_numBindings;
  uVar8 = (this->super_LayoutBindingNegativeCase).m_testType - TESTTYPE_BINDING_ARRAY;
  uVar10 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar10;
  }
  name = &(this->super_LayoutBindingNegativeCase).m_uniformName;
  local_a58 = 1;
  if (1 < uVar8) {
    local_a58 = uVar5;
  }
  for (; local_a58 != uVar10; uVar10 = uVar10 + 1) {
    poVar6 = std::operator<<(&vertexUniformDecl.super_basic_ostream<char,_std::char_traits<char>_>,
                             "layout(rgba8, binding = ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->super_LayoutBindingNegativeCase).m_vertexShaderBinding.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar10]);
    poVar6 = std::operator<<(poVar6,") uniform readonly highp ");
    poVar6 = std::operator<<(poVar6,(string *)&imageType);
    poVar6 = std::operator<<(poVar6," ");
    iVar9 = (int)uVar10;
    if (uVar8 < 2) {
      getUniformName((string *)&sources,name,iVar9,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    else {
      getUniformName((string *)&sources,name,iVar9);
    }
    poVar6 = std::operator<<(poVar6,(string *)&sources);
    std::operator<<(poVar6,";\n");
    std::__cxx11::string::~string((string *)&sources);
    poVar6 = std::operator<<(&fragmentUniformDecl.super_basic_ostream<char,_std::char_traits<char>_>
                             ,"layout(rgba8, binding = ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->super_LayoutBindingNegativeCase).m_fragmentShaderBinding.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar10]);
    poVar6 = std::operator<<(poVar6,") uniform readonly highp ");
    poVar6 = std::operator<<(poVar6,(string *)&imageType);
    poVar6 = std::operator<<(poVar6," ");
    if (uVar8 < 2) {
      getUniformName((string *)&sources,name,iVar9,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    else {
      getUniformName((string *)&sources,name,iVar9);
    }
    poVar6 = std::operator<<(poVar6,(string *)&sources);
    std::operator<<(poVar6,";\n");
    std::__cxx11::string::~string((string *)&sources);
    poVar6 = std::operator<<(&tessCtrlUniformDecl.super_basic_ostream<char,_std::char_traits<char>_>
                             ,"layout(rgba8, binding = ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->super_LayoutBindingNegativeCase).m_tessCtrlShaderBinding.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar10]);
    poVar6 = std::operator<<(poVar6,") uniform readonly highp ");
    poVar6 = std::operator<<(poVar6,(string *)&imageType);
    poVar6 = std::operator<<(poVar6," ");
    if (uVar8 < 2) {
      getUniformName((string *)&sources,name,iVar9,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    else {
      getUniformName((string *)&sources,name,iVar9);
    }
    poVar6 = std::operator<<(poVar6,(string *)&sources);
    std::operator<<(poVar6,";\n");
    std::__cxx11::string::~string((string *)&sources);
    poVar6 = std::operator<<(&tessEvalUniformDecl.super_basic_ostream<char,_std::char_traits<char>_>
                             ,"layout(rgba8, binding = ");
    poVar6 = (ostream *)
             std::ostream::operator<<
                       (poVar6,(this->super_LayoutBindingNegativeCase).m_tessEvalShaderBinding.
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[uVar10]);
    poVar6 = std::operator<<(poVar6,") uniform readonly highp ");
    poVar6 = std::operator<<(poVar6,(string *)&imageType);
    poVar6 = std::operator<<(poVar6," ");
    if (uVar8 < 2) {
      getUniformName((string *)&sources,name,iVar9,
                     (this->super_LayoutBindingNegativeCase).m_numBindings);
    }
    else {
      getUniformName((string *)&sources,name,iVar9);
    }
    poVar6 = std::operator<<(poVar6,(string *)&sources);
    std::operator<<(poVar6,";\n");
    std::__cxx11::string::~string((string *)&sources);
  }
  for (local_a80._0_4_ = SHADERTYPE_VERTEX;
      (int)local_a80._0_4_ < (this->super_LayoutBindingNegativeCase).m_numBindings;
      local_a80._0_4_ = local_a80._0_4_ + SHADERTYPE_FRAGMENT) {
    poVar6 = std::operator<<(&shaderBody.super_basic_ostream<char,_std::char_traits<char>_>,"\t");
    pcVar4 = "else if";
    if (local_a80._0_4_ == SHADERTYPE_VERTEX) {
      pcVar4 = "if";
    }
    poVar6 = std::operator<<(poVar6,pcVar4);
    poVar6 = std::operator<<(poVar6," (u_arrayNdx == ");
    de::toString<int>((string *)&sources,(int *)local_a80);
    poVar6 = std::operator<<(poVar6,(string *)&sources);
    poVar6 = std::operator<<(poVar6,")\n");
    poVar6 = std::operator<<(poVar6,"\t{\n");
    poVar6 = std::operator<<(poVar6,"\t\tcolor = imageLoad(");
    if (uVar8 < 2) {
      getUniformName((string *)local_858,name,0,local_a80._0_4_);
    }
    else {
      getUniformName((string *)local_858,name,local_a80._0_4_);
    }
    poVar6 = std::operator<<(poVar6,(string *)local_858);
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = std::operator<<(poVar6,(string *)&texCoordType);
    poVar6 = std::operator<<(poVar6,"(0));\n");
    std::operator<<(poVar6,"\t}\n");
    std::__cxx11::string::~string((string *)local_858);
    std::__cxx11::string::~string((string *)&sources);
  }
  poVar6 = std::operator<<(&shaderBody.super_basic_ostream<char,_std::char_traits<char>_>,"\telse\n"
                          );
  poVar6 = std::operator<<(poVar6,"\t{\n");
  poVar6 = std::operator<<(poVar6,"\t\tcolor = vec4(0.0, 0.0, 0.0, 1.0);\n");
  std::operator<<(poVar6,"\t}\n");
  memset(local_858,0,0xac);
  local_7a8 = (pointer)0x0;
  uStack_7a0 = 0;
  uStack_79f = 0;
  uStack_798 = 0;
  uStack_797 = 0;
  SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateVertexShader(&local_9d0,SVar2,&local_9f0,&local_a10);
  glu::VertexSource::VertexSource((VertexSource *)local_a80,&local_9d0);
  pPVar7 = glu::ProgramSources::operator<<((ProgramSources *)local_858,(ShaderSource *)local_a80);
  SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  generateFragmentShader(&local_a30,SVar2,&local_a50,&local_968);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_990,&local_a30);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)local_990);
  glu::ProgramSources::ProgramSources(&sources,pPVar7);
  std::__cxx11::string::~string((string *)(local_990 + 8));
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::~string((string *)&local_968);
  std::__cxx11::string::~string((string *)&local_a50);
  std::__cxx11::string::~string((string *)(local_a80 + 8));
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_9f0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_858);
  if ((this->super_LayoutBindingNegativeCase).m_tessSupport == true) {
    SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    generateTessControlShader((string *)local_990,SVar2,&local_9d0,&local_9f0);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_858,(string *)local_990);
    pPVar7 = glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_858);
    SVar2 = (this->super_LayoutBindingNegativeCase).m_shaderType;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringbuf::str();
    generateTessEvaluationShader(&local_a10,SVar2,&local_a30,&local_a50);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_a80,&local_a10);
    glu::ProgramSources::operator<<(pPVar7,(ShaderSource *)local_a80);
    std::__cxx11::string::~string((string *)(local_a80 + 8));
    std::__cxx11::string::~string((string *)&local_a10);
    std::__cxx11::string::~string((string *)&local_a50);
    std::__cxx11::string::~string((string *)&local_a30);
    std::__cxx11::string::~string((string *)(local_858 + 8));
    std::__cxx11::string::~string((string *)local_990);
    std::__cxx11::string::~string((string *)&local_9f0);
    std::__cxx11::string::~string((string *)&local_9d0);
  }
  this_00 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_00,((this->super_LayoutBindingNegativeCase).super_TestCase.m_context)->m_renderCtx
             ,&sources);
  glu::ProgramSources::~ProgramSources(&sources);
  std::__cxx11::string::~string((string *)&imageType);
  std::__cxx11::string::~string((string *)&texCoordType);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&shaderBody);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessEvalUniformDecl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&tessCtrlUniformDecl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fragmentUniformDecl);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vertexUniformDecl);
  return this_00;
}

Assistant:

glu::ShaderProgram* ImageBindingNegativeCase::generateShaders (void) const
{
	std::ostringstream		vertexUniformDecl;
	std::ostringstream		fragmentUniformDecl;
	std::ostringstream		tessCtrlUniformDecl;
	std::ostringstream		tessEvalUniformDecl;
	std::ostringstream		shaderBody;

	const std::string		texCoordType	= glu::getDataTypeName(getImageTexCoordType());
	const std::string		imageType		= glu::getDataTypeName(glu::getDataTypeFromGLType(m_imageType));
	const bool				arrayInstance	= (m_testType == TESTTYPE_BINDING_ARRAY || m_testType == TESTTYPE_BINDING_MAX_ARRAY);
	const int				numDeclarations = (arrayInstance ? 1 : m_numBindings);

	// Generate the uniform declarations for the vertex and fragment shaders
	for (int declNdx = 0; declNdx < numDeclarations; ++declNdx)
	{
		vertexUniformDecl << "layout(rgba8, binding = " << m_vertexShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
		fragmentUniformDecl << "layout(rgba8, binding = " << m_fragmentShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
		tessCtrlUniformDecl << "layout(rgba8, binding = " << m_tessCtrlShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
		tessEvalUniformDecl << "layout(rgba8, binding = " << m_tessEvalShaderBinding[declNdx] << ") uniform readonly highp " << imageType
			<< " " << (arrayInstance ? getUniformName(m_uniformName, declNdx, m_numBindings) : getUniformName(m_uniformName, declNdx)) << ";\n";
	}

	// Generate the shader body for the vertex and fragment shaders
	for (int bindNdx = 0; bindNdx < m_numBindings; ++bindNdx)
	{
		shaderBody	<< "	" << (bindNdx == 0 ? "if" : "else if") << " (u_arrayNdx == " << de::toString(bindNdx) << ")\n"
					<< "	{\n"
					<< "		color = imageLoad(" << (arrayInstance ? getUniformName(m_uniformName, 0, bindNdx) : getUniformName(m_uniformName, bindNdx)) << ", " << texCoordType << "(0));\n"
					<< "	}\n";
	}

	shaderBody	<< "	else\n"
				<< "	{\n"
				<< "		color = vec4(0.0, 0.0, 0.0, 1.0);\n"
				<< "	}\n";

	glu::ProgramSources sources = glu::ProgramSources()
				<< glu::VertexSource(generateVertexShader(m_shaderType, vertexUniformDecl.str(), shaderBody.str()))
				<< glu::FragmentSource(generateFragmentShader(m_shaderType, fragmentUniformDecl.str(), shaderBody.str()));

	if (m_tessSupport)
		sources << glu::TessellationControlSource(generateTessControlShader(m_shaderType, tessCtrlUniformDecl.str(), shaderBody.str()))
				<< glu::TessellationEvaluationSource(generateTessEvaluationShader(m_shaderType, tessEvalUniformDecl.str(), shaderBody.str()));

	return new glu::ShaderProgram(m_context.getRenderContext(), sources);
}